

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O3

bool SplitHostPort(string_view in,uint16_t *portOut,string *hostOut)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  char *__s;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  ulong __len2;
  long in_FS_OFFSET;
  bool bVar8;
  string_view str;
  uint16_t n;
  uint16_t local_3a;
  long local_38;
  
  __s = in._M_str;
  __len2 = in._M_len;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (__len2 == 0) {
    bVar2 = true;
  }
  else {
    pcVar1 = __s;
    sVar6 = 0;
    do {
      sVar5 = sVar6;
      pcVar3 = pcVar1;
      bVar2 = true;
      if (__len2 == sVar5) goto LAB_003f9c1f;
      sVar6 = sVar5 + 1;
      pcVar1 = pcVar3 + -1;
    } while (pcVar3[__len2 - 1] != ':');
    if (*__s == '[') {
      bVar8 = pcVar3[__len2 - 2] == ']';
    }
    else {
      bVar8 = false;
    }
    sVar7 = __len2 - sVar6;
    if (sVar7 == 0) {
LAB_003f9bc1:
      str._M_str = pcVar3 + -1 + __len2 + 1;
      str._M_len = sVar5;
      bVar2 = ParseUInt16(str,&local_3a);
      if (bVar2) {
        *portOut = local_3a;
        bVar2 = local_3a != 0;
        __len2 = sVar7;
      }
      else {
        bVar2 = false;
      }
    }
    else {
      uVar4 = __len2 - 1;
      if (sVar7 - 1 < __len2 - 1) {
        uVar4 = sVar7 - 1;
      }
      do {
        if (uVar4 == 0xffffffffffffffff) goto LAB_003f9bc1;
        pcVar1 = __s + uVar4;
        uVar4 = uVar4 - 1;
      } while (*pcVar1 != ':');
      if ((bool)(__len2 == sVar6 | bVar8)) goto LAB_003f9bc1;
    }
LAB_003f9c1f:
    if (__len2 != 0) {
      if ((*__s == '[') && (__s[__len2 - 1] == ']')) {
        uVar4 = __len2 - 2;
        __len2 = __len2 - 1;
        if (uVar4 <= __len2) {
          __len2 = uVar4;
        }
        __s = __s + 1;
      }
      goto LAB_003f9c47;
    }
  }
  __len2 = 0;
LAB_003f9c47:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (hostOut,0,hostOut->_M_string_length,__s,__len2);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool SplitHostPort(std::string_view in, uint16_t& portOut, std::string& hostOut)
{
    bool valid = false;
    size_t colon = in.find_last_of(':');
    // if a : is found, and it either follows a [...], or no other : is in the string, treat it as port separator
    bool fHaveColon = colon != in.npos;
    bool fBracketed = fHaveColon && (in[0] == '[' && in[colon - 1] == ']'); // if there is a colon, and in[0]=='[', colon is not 0, so in[colon-1] is safe
    bool fMultiColon{fHaveColon && colon != 0 && (in.find_last_of(':', colon - 1) != in.npos)};
    if (fHaveColon && (colon == 0 || fBracketed || !fMultiColon)) {
        uint16_t n;
        if (ParseUInt16(in.substr(colon + 1), &n)) {
            in = in.substr(0, colon);
            portOut = n;
            valid = (portOut != 0);
        }
    } else {
        valid = true;
    }
    if (in.size() > 0 && in[0] == '[' && in[in.size() - 1] == ']') {
        hostOut = in.substr(1, in.size() - 2);
    } else {
        hostOut = in;
    }

    return valid;
}